

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_method_ecdh_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  libssh2_curve_type local_34;
  uchar *puStack_30;
  libssh2_curve_type type;
  uchar *s;
  int rc;
  int ret;
  key_exchange_state_low_t *key_state_local;
  LIBSSH2_SESSION *session_local;
  
  s._4_4_ = 0;
  s._0_4_ = 0;
  if (key_state->state == libssh2_NB_state_idle) {
    key_state->public_key_oct = (uchar *)0x0;
    key_state->state = libssh2_NB_state_created;
  }
  _rc = key_state;
  key_state_local = (key_exchange_state_low_t *)session;
  if (key_state->state == libssh2_NB_state_created) {
    s._0_4_ = kex_session_ecdh_curve_type(session->kex->name,&local_34);
    if ((int)s != 0) {
      s._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,-1,"Unknown KEX nistp curve type")
      ;
      goto LAB_0010de89;
    }
    s._0_4_ = _libssh2_ecdsa_create_key
                        ((LIBSSH2_SESSION *)key_state_local,&_rc->private_key,&_rc->public_key_oct,
                         &_rc->public_key_oct_len,local_34);
    if ((int)s != 0) {
      s._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,(int)s,
                               "Unable to create private key");
      goto LAB_0010de89;
    }
    _rc->request[0] = '\x1e';
    puStack_30 = _rc->request + 1;
    _libssh2_store_str(&stack0xffffffffffffffd0,(char *)_rc->public_key_oct,_rc->public_key_oct_len)
    ;
    _rc->request_len = _rc->public_key_oct_len + 5;
    _rc->state = libssh2_NB_state_sent;
  }
  if (_rc->state == libssh2_NB_state_sent) {
    s._0_4_ = _libssh2_transport_send
                        ((LIBSSH2_SESSION *)key_state_local,_rc->request,_rc->request_len,
                         (uchar *)0x0,0);
    if ((int)s == -0x25) {
      return -0x25;
    }
    if ((int)s != 0) {
      s._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,(int)s,"Unable to send ECDH_INIT")
      ;
      goto LAB_0010de89;
    }
    _rc->state = libssh2_NB_state_sent1;
  }
  if (_rc->state == libssh2_NB_state_sent1) {
    s._0_4_ = _libssh2_packet_require
                        ((LIBSSH2_SESSION *)key_state_local,'\x1f',&_rc->data,&_rc->data_len,0,
                         (uchar *)0x0,0,&_rc->req_state);
    if ((int)s == -0x25) {
      return -0x25;
    }
    if ((int)s != 0) {
      s._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,(int)s,
                               "Timeout waiting for ECDH_REPLY reply");
      goto LAB_0010de89;
    }
    _rc->state = libssh2_NB_state_sent2;
  }
  if (_rc->state == libssh2_NB_state_sent2) {
    s._0_4_ = kex_session_ecdh_curve_type
                        (*(char **)(key_state_local->exchange_state).tmp_len,&local_34);
    if ((int)s == 0) {
      s._4_4_ = ecdh_sha2_nistp((LIBSSH2_SESSION *)key_state_local,local_34,_rc->data,_rc->data_len,
                                _rc->public_key_oct,_rc->public_key_oct_len,_rc->private_key,
                                &_rc->exchange_state);
      if (s._4_4_ == -0x25) {
        return -0x25;
      }
      (**(code **)&key_state_local->exchange_state)(_rc->data,key_state_local);
    }
    else {
      s._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,-1,"Unknown KEX nistp curve type")
      ;
    }
  }
LAB_0010de89:
  if (_rc->public_key_oct != (uchar *)0x0) {
    (**(code **)&key_state_local->exchange_state)(_rc->public_key_oct,key_state_local);
    _rc->public_key_oct = (uchar *)0x0;
  }
  if (_rc->private_key != (EVP_PKEY *)0x0) {
    EVP_PKEY_free((EVP_PKEY *)_rc->private_key);
    _rc->private_key = (EVP_PKEY *)0x0;
  }
  _rc->state = libssh2_NB_state_idle;
  return s._4_4_;
}

Assistant:

static int
kex_method_ecdh_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;
    unsigned char *s;
    libssh2_curve_type type;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        rc = kex_session_ecdh_curve_type(session->kex->name, &type);

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX nistp curve type");
            goto ecdh_clean_exit;
        }

        rc = _libssh2_ecdsa_create_key(session, &key_state->private_key,
                                       &key_state->public_key_oct,
                                       &key_state->public_key_oct_len, type);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto ecdh_clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->public_key_oct,
                           key_state->public_key_oct_len);
        key_state->request_len = key_state->public_key_oct_len + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating ECDH SHA2 NISTP256"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto ecdh_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto ecdh_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        rc = kex_session_ecdh_curve_type(session->kex->name, &type);

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX nistp curve type");
            goto ecdh_clean_exit;
        }

        ret = ecdh_sha2_nistp(session, type, key_state->data,
                              key_state->data_len,
                              (unsigned char *)key_state->public_key_oct,
                              key_state->public_key_oct_len,
                              key_state->private_key,
                              &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

ecdh_clean_exit:

    if(key_state->public_key_oct) {
        LIBSSH2_FREE(session, key_state->public_key_oct);
        key_state->public_key_oct = NULL;
    }

    if(key_state->private_key) {
        _libssh2_ecdsa_free(key_state->private_key);
        key_state->private_key = NULL;
    }

    key_state->state = libssh2_NB_state_idle;

    return ret;
}